

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

bool __thiscall Catch::SourceLineInfo::operator==(SourceLineInfo *this,SourceLineInfo *other)

{
  size_t __n;
  int iVar1;
  
  if ((this->line == other->line) &&
     (__n = (this->file)._M_string_length, __n == (other->file)._M_string_length)) {
    if (__n != 0) {
      iVar1 = bcmp((this->file)._M_dataplus._M_p,(other->file)._M_dataplus._M_p,__n);
      return iVar1 == 0;
    }
    return true;
  }
  return false;
}

Assistant:

bool SourceLineInfo::operator == ( SourceLineInfo const& other ) const {
        return line == other.line && file == other.file;
    }